

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::CollationIterator::getCE32FromPrefix
          (CollationIterator *this,CollationData *d,uint32_t ce32,UErrorCode *errorCode)

{
  UChar *pUVar1;
  int32_t iVar2;
  int cp;
  UStringTrieResult UVar3;
  UStringTrieResult match;
  UChar32 c;
  ConstChar16Ptr local_60;
  undefined1 local_58 [8];
  UCharsTrie prefixes;
  int32_t lookBehind;
  UChar *p;
  UErrorCode *errorCode_local;
  uint32_t ce32_local;
  CollationData *d_local;
  CollationIterator *this_local;
  
  pUVar1 = d->contexts;
  iVar2 = Collation::indexFromCE32(ce32);
  errorCode_local._4_4_ = CollationData::readCE32(pUVar1 + iVar2);
  prefixes._28_4_ = 0;
  ConstChar16Ptr::ConstChar16Ptr(&local_60,pUVar1 + iVar2 + 2);
  UCharsTrie::UCharsTrie((UCharsTrie *)local_58,&local_60);
  ConstChar16Ptr::~ConstChar16Ptr(&local_60);
  do {
    cp = (*(this->super_UObject)._vptr_UObject[7])(this,errorCode);
    if (cp < 0) break;
    prefixes._28_4_ = prefixes._28_4_ + 1;
    UVar3 = UCharsTrie::nextForCodePoint((UCharsTrie *)local_58,cp);
    if (1 < (int)UVar3) {
      errorCode_local._4_4_ = UCharsTrie::getValue((UCharsTrie *)local_58);
    }
  } while ((UVar3 & USTRINGTRIE_NO_VALUE) != USTRINGTRIE_NO_MATCH);
  (*(this->super_UObject)._vptr_UObject[0xc])(this,(ulong)(uint)prefixes._28_4_,errorCode);
  UCharsTrie::~UCharsTrie((UCharsTrie *)local_58);
  return errorCode_local._4_4_;
}

Assistant:

uint32_t
CollationIterator::getCE32FromPrefix(const CollationData *d, uint32_t ce32,
                                     UErrorCode &errorCode) {
    const UChar *p = d->contexts + Collation::indexFromCE32(ce32);
    ce32 = CollationData::readCE32(p);  // Default if no prefix match.
    p += 2;
    // Number of code points read before the original code point.
    int32_t lookBehind = 0;
    UCharsTrie prefixes(p);
    for(;;) {
        UChar32 c = previousCodePoint(errorCode);
        if(c < 0) { break; }
        ++lookBehind;
        UStringTrieResult match = prefixes.nextForCodePoint(c);
        if(USTRINGTRIE_HAS_VALUE(match)) {
            ce32 = (uint32_t)prefixes.getValue();
        }
        if(!USTRINGTRIE_HAS_NEXT(match)) { break; }
    }
    forwardNumCodePoints(lookBehind, errorCode);
    return ce32;
}